

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

size_t __thiscall
jsoncons::jmespath::detail::
token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::precedence_level
          (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *this)

{
  undefined8 uVar1;
  assertion_error *this_00;
  allocator<char> *in_RDI;
  string *in_stack_ffffffffffffff28;
  assertion_error *in_stack_ffffffffffffff30;
  int iVar2;
  undefined2 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  size_t local_8;
  
  iVar2 = *(int *)in_RDI;
  if (iVar2 == 0xd) {
    if (*(long *)(in_RDI + 0x28) == 0) {
      uVar3 = 1;
      this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff70,
                 (char *)CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffff6c,iVar2))),in_RDI)
      ;
      assertion_error::assertion_error(this_00,in_stack_ffffffffffffff28);
      __cxa_throw(this_00,&assertion_error::typeinfo,assertion_error::~assertion_error);
    }
    local_8 = expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ::precedence_level(*(expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                                   **)(in_RDI + 0x28));
  }
  else if (iVar2 == 0xe) {
    if (*(long *)(in_RDI + 0x28) == 0) {
      uVar1 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff70,
                 (char *)CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,
                                           CONCAT24(in_stack_ffffffffffffff6c,iVar2))),in_RDI);
      assertion_error::assertion_error(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      __cxa_throw(uVar1,&assertion_error::typeinfo,assertion_error::~assertion_error);
    }
    local_8 = binary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ::precedence_level(*(binary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                                   **)(in_RDI + 0x28));
  }
  else if (iVar2 == 0xf) {
    if (*(long *)(in_RDI + 0x28) == 0) {
      uVar1 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff70,
                 (char *)CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,
                                           CONCAT24(in_stack_ffffffffffffff6c,iVar2))),in_RDI);
      assertion_error::assertion_error(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      __cxa_throw(uVar1,&assertion_error::typeinfo,assertion_error::~assertion_error);
    }
    local_8 = unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ::precedence_level(*(unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                                   **)(in_RDI + 0x28));
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

std::size_t precedence_level() const
        {
            switch(type_)
            {
                case token_kind::unary_operator:
                    JSONCONS_ASSERT(unary_operator_ != nullptr);
                    return unary_operator_->precedence_level();
                case token_kind::binary_operator:
                    JSONCONS_ASSERT(binary_operator_ != nullptr);
                    return binary_operator_->precedence_level();
                case token_kind::expression:
                    JSONCONS_ASSERT(expression_ != nullptr);
                    return expression_->precedence_level();
                default:
                    return 0;
            }
        }